

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

bool ctemplate::Template::StringToTemplateCache(TemplateString *key,TemplateString *content)

{
  bool bVar1;
  bool bVar2;
  int i;
  Strip strip;
  
  bVar2 = true;
  strip = DO_NOT_STRIP;
  do {
    pthread_once(&g_default_cache_init_once,CreateTemplateCache);
    bVar1 = TemplateCache::StringToTemplateCache(g_default_template_cache,key,content,strip);
    bVar2 = (bool)(bVar2 & bVar1);
    strip = strip + STRIP_BLANK_LINES;
  } while (strip != NUM_STRIPS);
  return bVar2;
}

Assistant:

bool Template::StringToTemplateCache(const TemplateString& key,
                                     const TemplateString& content) {
  // We say the insert succeeded only if it succeded for all strip values.
  bool retval = true;
  for (int i = 0; i < static_cast<int>(NUM_STRIPS); ++i) {
    if (!GOOGLE_NAMESPACE::StringToTemplateCache(key, content, static_cast<Strip>(i)))
      retval = false;
  }
  return retval;
}